

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RationalTangentialThinPrismDistortion::getProperties
          (RationalTangentialThinPrismDistortion *this,Properties *prop,int id)

{
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [28];
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  double *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Properties *in_stack_ffffffffffffff50;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_a8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_e8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_108);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_128);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_148);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_168);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_188);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_1a8);
  return;
}

Assistant:

void RationalTangentialThinPrismDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("p1", id).c_str(), kd[0]);
  prop.putValue(getCameraKey("p2", id).c_str(), kd[1]);

  prop.putValue(getCameraKey("k1", id).c_str(), kd[2]);
  prop.putValue(getCameraKey("k2", id).c_str(), kd[3]);
  prop.putValue(getCameraKey("k3", id).c_str(), kd[4]);
  prop.putValue(getCameraKey("k4", id).c_str(), kd[5]);
  prop.putValue(getCameraKey("k5", id).c_str(), kd[6]);
  prop.putValue(getCameraKey("k6", id).c_str(), kd[7]);

  prop.putValue(getCameraKey("s1", id).c_str(), kd[8]);
  prop.putValue(getCameraKey("s2", id).c_str(), kd[9]);
  prop.putValue(getCameraKey("s3", id).c_str(), kd[10]);
  prop.putValue(getCameraKey("s4", id).c_str(), kd[11]);
}